

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

bool __thiscall wabt::WastParser::ParseElemExprOpt(WastParser *this,ExprList *out_elem_expr)

{
  Expr *pEVar1;
  Expr *pEVar2;
  _func_int ***ppp_Var3;
  bool bVar4;
  Result RVar5;
  ExprList exprs;
  ExprList local_38;
  
  bVar4 = MatchLpar(this,Item);
  local_38.first_ = (Expr *)0x0;
  local_38.last_ = (Expr *)0x0;
  local_38.size_ = 0;
  if (bVar4) {
    RVar5 = ParseTerminatingInstrList(this,&local_38);
    if (RVar5.enum_ == Ok) {
      RVar5 = Expect(this,Rpar);
      bVar4 = true;
      pEVar1 = local_38.first_;
      if (RVar5.enum_ == Error) goto joined_r0x00193e48;
LAB_00193dea:
      if (local_38.size_ != 0) {
        pEVar1 = out_elem_expr->first_;
        while (pEVar1 != (Expr *)0x0) {
          ppp_Var3 = &pEVar1->_vptr_Expr;
          pEVar1 = (pEVar1->super_intrusive_list_base<wabt::Expr>).next_;
          (*(*ppp_Var3)[1])();
        }
        out_elem_expr->first_ = (Expr *)0x0;
        out_elem_expr->last_ = (Expr *)0x0;
        out_elem_expr->size_ = 0;
        out_elem_expr->first_ = local_38.first_;
        out_elem_expr->last_ = local_38.last_;
        out_elem_expr->size_ = local_38.size_;
        local_38.size_ = 0;
        local_38.first_ = (Expr *)0x0;
        local_38.last_ = (Expr *)0x0;
        bVar4 = true;
        pEVar1 = local_38.first_;
        goto joined_r0x00193e48;
      }
    }
  }
  else {
    RVar5 = ParseExpr(this,&local_38);
    if (RVar5.enum_ == Ok) goto LAB_00193dea;
  }
  bVar4 = false;
  pEVar1 = local_38.first_;
joined_r0x00193e48:
  while (pEVar1 != (Expr *)0x0) {
    pEVar2 = (pEVar1->super_intrusive_list_base<wabt::Expr>).next_;
    (*pEVar1->_vptr_Expr[1])();
    pEVar1 = pEVar2;
  }
  return bVar4;
}

Assistant:

bool WastParser::ParseElemExprOpt(ExprList* out_elem_expr) {
  WABT_TRACE(ParseElemExprOpt);
  bool item = MatchLpar(TokenType::Item);
  ExprList exprs;
  if (item) {
    if (ParseTerminatingInstrList(&exprs) != Result::Ok) {
      return false;
    }
    EXPECT(Rpar);
  } else {
    if (ParseExpr(&exprs) != Result::Ok) {
      return false;
    }
  }
  if (!exprs.size()) {
    return false;
  }
  *out_elem_expr = std::move(exprs);
  return true;
}